

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void Am_Text_Create_Start_Do_proc(Am_Object *inter,Am_Object *object,Am_Inter_Location *data)

{
  bool bVar1;
  Am_Wrapper *value;
  ostream *poVar2;
  Am_Object local_30;
  Am_Object local_28;
  
  bVar1 = Am_Object::operator==(object,inter);
  if (bVar1) {
    am_create_new_object(&local_28,inter,(Am_Inter_Location *)&Am_No_Object,(Am_Object *)data,true);
    Am_Object::operator=(object,&local_28);
    Am_Object::~Am_Object(&local_28);
    value = Am_Object::operator_cast_to_Am_Wrapper_(object);
    Am_Object::Set(inter,0x16d,value,0);
    Am_Object::Am_Object(&local_30,object);
    Am_Move_Cursor_To(&local_30,0);
    Am_Object::~Am_Object(&local_30);
    Am_Object::Set(inter,0x1e6,true,1);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar2 = std::operator<<(poVar2,"Text_Create but not inter: ");
  poVar2 = operator<<(poVar2,object);
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Current_Location_Method, void, Am_Text_Create_Start_Do,
                 (Am_Object inter, Am_Object object, Am_Inter_Location data))
{
  //object_modified set by Am_Text_Start_Method, override if creating new obj
  //use Am_CREATED_GROUP to say if created a new object or not
  if (object == inter) {
    object =
        am_create_new_object(inter, Am_No_Object, data, Am_No_Object, false);
    inter.Set(Am_OBJECT_MODIFIED, object);
    Am_Move_Cursor_To(object, 0);
    inter.Set(Am_CREATED_GROUP, true, Am_OK_IF_NOT_THERE);
  } else
    Am_ERROR("Text_Create but not inter: " << object);
}